

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::extend<8ul,unsigned_char,unsigned_short,(wasm::LaneOrder)1>
          (Literal *__return_storage_ptr__,wasm *this,Literal *vec)

{
  Type *other;
  uint uVar1;
  long lVar2;
  Literal *this_00;
  Literal *this_01;
  bool bVar3;
  undefined1 local_288 [8];
  LaneArray<8UL_*_2> lanes;
  LaneArray<8UL> result;
  
  getLanes<unsigned_char,16>((LaneArray<16> *)local_288,this,vec);
  this_00 = (Literal *)&lanes._M_elems[0xf].type;
  memset(this_00,0,0xc0);
  lVar2 = 8;
  this_01 = (Literal *)&lanes._M_elems[7].type;
  other = &result._M_elems[7].type;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    uVar1 = Literal::geti32(this_01);
    result._M_elems[7].type.id._0_4_ = uVar1 & 0xff;
    if (this_00 != (Literal *)other) {
      Literal::~Literal(this_00);
      Literal::Literal(this_00,(Literal *)other);
    }
    Literal::~Literal((Literal *)other);
    this_00 = this_00 + 1;
    this_01 = this_01 + 1;
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<8> *)&lanes._M_elems[0xf].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&lanes._M_elems[0xf].type);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_288);
  return __return_storage_ptr__;
}

Assistant:

Literal extend(const Literal& vec) {
  LaneArray<Lanes* 2> lanes = getLanes<LaneFrom, Lanes * 2>(vec);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lanes[idx].geti32());
  }
  return Literal(result);
}